

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O3

ATNPath * __thiscall
Centaurus::CompositeATN<unsigned_char>::convert_atn_path
          (ATNPath *__return_storage_ptr__,CompositeATN<unsigned_char> *this,ATNPath *path)

{
  const_iterator cVar1;
  int *piVar2;
  ATNPath *path_1;
  int iVar3;
  long lVar4;
  long lVar5;
  
  cVar1 = std::
          _Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_dict)._M_h,
                 &(path->
                  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                  ).
                  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].first);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  iVar3 = -1;
  lVar4 = *(long *)((long)cVar1.
                          super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>,_true>
                          ._M_cur + 0x40) -
          *(long *)((long)cVar1.
                          super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>,_true>
                          ._M_cur + 0x38);
  if (lVar4 != 0) {
    lVar4 = (lVar4 >> 4) * -0x3333333333333333;
    piVar2 = (int *)(*(long *)((long)cVar1.
                                     super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>,_true>
                                     ._M_cur + 0x38) + 0x48);
    lVar5 = 0;
    do {
      if (*piVar2 ==
          (path->
          super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
          ).
          super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].second) {
        iVar3 = (int)lVar5;
        break;
      }
      lVar5 = lVar5 + 1;
      piVar2 = piVar2 + 0x14;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  std::
  vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ::vector(&__return_storage_ptr__->
            super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
           ,&path->
             super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
          );
  __return_storage_ptr__->_vptr_ATNPath = (_func_int **)&PTR__ATNPath_001a0a40;
  (__return_storage_ptr__->
  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ).
  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1].second = iVar3;
  return __return_storage_ptr__;
}

Assistant:

const ATNPath convert_atn_path(const ATNPath& path) const
    {
        const CATNMachine<TCHAR>& machine = m_dict.at(path.leaf_id());

        return path.replace_index(machine.convert_atn_index(path.leaf_index()));
    }